

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::endMode(TestSpecParser *this)

{
  TestSpecParser *in_RDI;
  TestSpecParser *in_stack_00000050;
  TestSpecParser *in_stack_000000b0;
  
  switch(in_RDI->m_mode) {
  case None:
  default:
    startNewMode(in_RDI,None);
    break;
  case Name:
  case QuotedName:
    addNamePattern(in_stack_00000050);
    break;
  case Tag:
    addTagPattern(in_stack_000000b0);
    break;
  case EscapedName:
    revertBackToLastMode(in_RDI);
  }
  return;
}

Assistant:

void TestSpecParser::endMode() {
        switch( m_mode ) {
        case Name:
        case QuotedName:
            return addNamePattern();
        case Tag:
            return addTagPattern();
        case EscapedName:
            revertBackToLastMode();
            return;
        case None:
        default:
            return startNewMode( None );
        }
    }